

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O2

int oonf_cfg_update_globalcfg(_Bool raw)

{
  int iVar1;
  cfg_named_section *named;
  cfg_db **ppcVar2;
  undefined7 in_register_00000039;
  
  ppcVar2 = &_oonf_work_db;
  if ((int)CONCAT71(in_register_00000039,raw) != 0) {
    ppcVar2 = &_oonf_raw_db;
  }
  named = cfg_db_find_namedsection(*ppcVar2,"global",(char *)0x0);
  iVar1 = cfg_schema_tobin(&config_global,named,_global_entries,6);
  oonf_subsystem_set_path(config_global.plugin_path);
  return iVar1;
}

Assistant:

int
oonf_cfg_update_globalcfg(bool raw) {
  struct cfg_named_section *named;
  int result;

  named = cfg_db_find_namedsection(raw ? _oonf_raw_db : _oonf_work_db, CFG_SECTION_GLOBAL, NULL);

  result = cfg_schema_tobin(&config_global, named, _global_entries, ARRAYSIZE(_global_entries));

  /* set plugin path */
  oonf_subsystem_set_path(config_global.plugin_path);

  return result;
}